

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSaveSetIndentString(void)

{
  int iVar1;
  int iVar2;
  char *val;
  uint local_34;
  int n_indent;
  char *indent;
  int n_ctxt;
  xmlSaveCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (indent._4_4_ = 0; (int)indent._4_4_ < 1; indent._4_4_ = indent._4_4_ + 1) {
    for (local_34 = 0; (int)local_34 < 4; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_const_char_ptr(local_34,1);
      iVar2 = xmlSaveSetIndentString(0,val);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_const_char_ptr(local_34,val,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSaveSetIndentString",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)indent._4_4_);
        printf(" %d",(ulong)local_34);
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlSaveSetIndentString(void) {
    int test_ret = 0;

#if defined(LIBXML_OUTPUT_ENABLED)
    int mem_base;
    int ret_val;
    xmlSaveCtxtPtr ctxt; /* save context */
    int n_ctxt;
    const char * indent; /* indent string */
    int n_indent;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlSaveCtxtPtr;n_ctxt++) {
    for (n_indent = 0;n_indent < gen_nb_const_char_ptr;n_indent++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlSaveCtxtPtr(n_ctxt, 0);
        indent = gen_const_char_ptr(n_indent, 1);

        ret_val = xmlSaveSetIndentString(ctxt, indent);
        desret_int(ret_val);
        call_tests++;
        des_xmlSaveCtxtPtr(n_ctxt, ctxt, 0);
        des_const_char_ptr(n_indent, indent, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSaveSetIndentString",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_indent);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}